

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O3

void helper_retry_sparc64(CPUSPARCState_conflict1 *env)

{
  uint64_t uVar1;
  uint uVar2;
  trap_state *ptVar3;
  uint uVar4;
  
  ptVar3 = cpu_tsptr_sparc64(env);
  uVar1 = ptVar3->tnpc;
  env->pc = ptVar3->tpc;
  env->npc = uVar1;
  uVar1 = ptVar3->tstate;
  uVar4 = (uint)(uVar1 >> 0x20);
  env->xcc = (uVar4 & 0xfffffff0) << 0x10;
  env->psr = (uVar4 & 0xf) << 0x14;
  env->cc_op = 1;
  env->asi = (uint)(uVar1 >> 0x18) & 0xff;
  cpu_change_pstate_sparc64(env,(uint)uVar1 >> 8 & 0xf3f);
  uVar2 = (uint)ptVar3->tstate & 0xff;
  uVar4 = env->nwindows;
  if (uVar4 <= uVar2) {
    uVar2 = (uint)(byte)(((ushort)ptVar3->tstate & 0xff) % (ushort)(byte)uVar4);
  }
  cpu_set_cwp_sparc64(env,uVar4 + ~uVar2);
  if (((env->def).features & 0x800) != 0) {
    uVar4 = (uint)(ptVar3->tstate >> 0x28) & 7;
    env->hpstate = env->htstate[env->tl];
    cpu_gl_switch_gregs_sparc64(env,uVar4);
    env->gl = uVar4;
  }
  env->tl = env->tl - 1;
  return;
}

Assistant:

void helper_retry(CPUSPARCState *env)
{
    trap_state *tsptr = cpu_tsptr(env);

    env->pc = tsptr->tpc;
    env->npc = tsptr->tnpc;
    cpu_put_ccr(env, tsptr->tstate >> 32);
    env->asi = (tsptr->tstate >> 24) & 0xff;
    cpu_change_pstate(env, (tsptr->tstate >> 8) & 0xf3f);
    cpu_put_cwp64(env, tsptr->tstate & 0xff);
    if (cpu_has_hypervisor(env)) {
        uint32_t new_gl = (tsptr->tstate >> 40) & 7;
        env->hpstate = env->htstate[env->tl];
        cpu_gl_switch_gregs(env, new_gl);
        env->gl = new_gl;
    }
    env->tl--;

    if (cpu_interrupts_enabled(env)) {
        // cpu_check_irqs(env);
    }
}